

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_div(mp_int *a,mp_int *b,mp_int *c,mp_int *d)

{
  int iVar1;
  int iVar2;
  mp_digit *pmVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  mp_digit mVar14;
  int b_00;
  long lVar15;
  int b_01;
  undefined1 auVar16 [16];
  int local_ec;
  mp_int x;
  mp_int y;
  mp_int t1;
  mp_int q;
  mp_int t2;
  mp_int t;
  
  if (b->used == 0) {
    return -3;
  }
  iVar8 = mp_cmp_mag(a,b);
  if (iVar8 == -1) {
    if (d == (mp_int *)0x0) {
      iVar8 = 0;
    }
    else {
      iVar8 = mp_copy(a,d);
    }
    if (c == (mp_int *)0x0) {
      return iVar8;
    }
    mp_zero(c);
    return iVar8;
  }
  iVar8 = mp_init_size(&q,a->used + 2);
  if (iVar8 != 0) {
    return iVar8;
  }
  q.used = a->used + 2;
  iVar8 = mp_init(&t1);
  if (iVar8 != 0) goto LAB_00104c28;
  iVar8 = mp_init(&t2);
  if (iVar8 == 0) {
    iVar8 = mp_init_copy(&x,a);
    if (iVar8 == 0) {
      iVar8 = mp_init_copy(&y,b);
      if (iVar8 == 0) {
        iVar2 = a->sign;
        iVar1 = b->sign;
        y.sign = 0;
        x._8_8_ = x._8_8_ & 0xffffffff00000000;
        iVar8 = mp_count_bits(&y);
        b_01 = 0;
        if (iVar8 % 0x3c < 0x3b) {
          b_01 = 0x3b - iVar8 % 0x3c;
          iVar8 = mp_mul_2d(&x,b_01,&x);
          if ((iVar8 != 0) || (iVar8 = mp_mul_2d(&y,b_01,&y), iVar8 != 0)) goto LAB_00104bfa;
        }
        lVar12 = (long)x.used;
        b_00 = x.used - y.used;
        iVar8 = mp_lshd(&y,b_00);
        pmVar3 = q.dp;
        if (iVar8 == 0) {
          lVar10 = (long)y.used;
          do {
            iVar8 = mp_cmp(&x,&y);
            if (iVar8 == -1) {
              mp_rshd(&y,b_00);
              uVar9 = ~y.used;
              goto LAB_00104cad;
            }
            pmVar3[b_00] = pmVar3[b_00] + 1;
            iVar8 = mp_sub(&x,&y,&x);
          } while (iVar8 == 0);
        }
        goto LAB_00104bfa;
      }
      goto LAB_00104c04;
    }
    goto LAB_00104c0e;
  }
  goto LAB_00104c1b;
LAB_00104cad:
  lVar13 = lVar12;
  if (lVar10 < lVar13) {
    lVar12 = lVar13 + -1;
    if (lVar12 <= x.used) {
      uVar11 = x.dp[lVar13 + -1];
      local_ec = (int)lVar13;
      if (uVar11 == y.dp[lVar10 + -1]) {
        lVar15 = (long)(int)(uVar9 + local_ec);
        pmVar3[lVar15] = 0xfffffffffffffff;
        uVar11 = 0;
      }
      else {
        auVar16 = __udivti3(uVar11 << 0x3c | x.dp[lVar13 + -2],uVar11 >> 4,y.dp[lVar10 + -1],0);
        uVar11 = auVar16._0_8_;
        if (0xffffffffffffffe < uVar11) {
          uVar11 = 0xfffffffffffffff;
        }
        if (auVar16._8_8_ != 0) {
          uVar11 = 0xfffffffffffffff;
        }
        lVar15 = (long)(int)(uVar9 + local_ec);
        pmVar3[lVar15] = uVar11;
        uVar11 = uVar11 + 1 & 0xfffffffffffffff;
      }
      local_ec = uVar9 + local_ec;
      pmVar3[lVar15] = uVar11;
      do {
        pmVar3[lVar15] = pmVar3[lVar15] + 0xfffffffffffffff & 0xfffffffffffffff;
        mp_zero(&t1);
        if (y.used < 2) {
          mVar14 = 0;
        }
        else {
          mVar14 = y.dp[(ulong)(uint)y.used - 2];
        }
        *t1.dp = mVar14;
        t1.dp[1] = y.dp[lVar10 + -1];
        t1.used = 2;
        iVar8 = mp_mul_d(&t1,pmVar3[lVar15],&t1);
        if (iVar8 != 0) goto LAB_00104bfa;
        if (lVar13 < 3) {
          *t2.dp = 0;
          if (lVar13 == 2) goto LAB_00104e28;
          mVar14 = 0;
        }
        else {
          *t2.dp = x.dp[lVar13 + -3];
LAB_00104e28:
          mVar14 = x.dp[lVar13 + -2];
        }
        t2.dp[1] = mVar14;
        t2.dp[2] = x.dp[lVar13 + -1];
        t2.used = 3;
        iVar8 = mp_cmp_mag(&t1,&t2);
      } while (iVar8 == 1);
      iVar8 = mp_mul_d(&y,pmVar3[lVar15],&t1);
      if (((iVar8 != 0) || (iVar8 = mp_lshd(&t1,local_ec), iVar8 != 0)) ||
         (iVar8 = mp_sub(&x,&t1,&x), iVar8 != 0)) goto LAB_00104bfa;
      if (x.sign == 1) {
        iVar8 = mp_copy(&y,&t1);
        if (((iVar8 != 0) || (iVar8 = mp_lshd(&t1,local_ec), iVar8 != 0)) ||
           (iVar8 = mp_add(&x,&t1,&x), iVar8 != 0)) goto LAB_00104bfa;
        pmVar3[lVar15] = pmVar3[lVar15] + 0xfffffffffffffff & 0xfffffffffffffff;
      }
    }
    goto LAB_00104cad;
  }
  if (x.used == 0) {
    iVar8 = 0;
  }
  else {
    iVar8 = a->sign;
  }
  x.sign = iVar8;
  if (c != (mp_int *)0x0) {
    mp_clamp(&q);
    pmVar3 = c->dp;
    uVar4._0_4_ = c->used;
    uVar4._4_4_ = c->alloc;
    uVar5._0_4_ = c->sign;
    uVar5._4_4_ = *(undefined4 *)&c->field_0xc;
    c->used = q.used;
    c->alloc = q.alloc;
    c->sign = q.sign;
    *(undefined4 *)&c->field_0xc = q._12_4_;
    c->dp = q.dp;
    c->sign = (uint)(iVar2 != iVar1);
    q._0_8_ = uVar4;
    q._8_8_ = uVar5;
    q.dp = pmVar3;
  }
  iVar8 = 0;
  if (d != (mp_int *)0x0) {
    mp_div_2d(&x,b_01,&x,(mp_int *)0x0);
    pmVar3 = d->dp;
    uVar6._0_4_ = d->used;
    uVar6._4_4_ = d->alloc;
    uVar7._0_4_ = d->sign;
    uVar7._4_4_ = *(undefined4 *)&d->field_0xc;
    d->used = x.used;
    d->alloc = x.alloc;
    d->sign = x.sign;
    *(undefined4 *)&d->field_0xc = x._12_4_;
    d->dp = x.dp;
    x._0_8_ = uVar6;
    x._8_8_ = uVar7;
    x.dp = pmVar3;
  }
LAB_00104bfa:
  mp_clear(&y);
LAB_00104c04:
  mp_clear(&x);
LAB_00104c0e:
  mp_clear(&t2);
LAB_00104c1b:
  mp_clear(&t1);
LAB_00104c28:
  mp_clear(&q);
  return iVar8;
}

Assistant:

int mp_div (mp_int * a, mp_int * b, mp_int * c, mp_int * d)
{
  mp_int  q, x, y, t1, t2;
  int     res, n, t, i, norm, neg;

  /* is divisor zero ? */
  if (mp_iszero (b) == 1) {
    return MP_VAL;
  }

  /* if a < b then q=0, r = a */
  if (mp_cmp_mag (a, b) == MP_LT) {
    if (d != NULL) {
      res = mp_copy (a, d);
    } else {
      res = MP_OKAY;
    }
    if (c != NULL) {
      mp_zero (c);
    }
    return res;
  }

  if ((res = mp_init_size (&q, a->used + 2)) != MP_OKAY) {
    return res;
  }
  q.used = a->used + 2;

  if ((res = mp_init (&t1)) != MP_OKAY) {
    goto LBL_Q;
  }

  if ((res = mp_init (&t2)) != MP_OKAY) {
    goto LBL_T1;
  }

  if ((res = mp_init_copy (&x, a)) != MP_OKAY) {
    goto LBL_T2;
  }

  if ((res = mp_init_copy (&y, b)) != MP_OKAY) {
    goto LBL_X;
  }

  /* fix the sign */
  neg = (a->sign == b->sign) ? MP_ZPOS : MP_NEG;
  x.sign = y.sign = MP_ZPOS;

  /* normalize both x and y, ensure that y >= b/2, [b == 2**DIGIT_BIT] */
  norm = mp_count_bits(&y) % DIGIT_BIT;
  if (norm < (int)(DIGIT_BIT-1)) {
     norm = (DIGIT_BIT-1) - norm;
     if ((res = mp_mul_2d (&x, norm, &x)) != MP_OKAY) {
       goto LBL_Y;
     }
     if ((res = mp_mul_2d (&y, norm, &y)) != MP_OKAY) {
       goto LBL_Y;
     }
  } else {
     norm = 0;
  }

  /* note hac does 0 based, so if used==5 then its 0,1,2,3,4, e.g. use 4 */
  n = x.used - 1;
  t = y.used - 1;

  /* while (x >= y*b**n-t) do { q[n-t] += 1; x -= y*b**{n-t} } */
  if ((res = mp_lshd (&y, n - t)) != MP_OKAY) { /* y = y*b**{n-t} */
    goto LBL_Y;
  }

  while (mp_cmp (&x, &y) != MP_LT) {
    ++(q.dp[n - t]);
    if ((res = mp_sub (&x, &y, &x)) != MP_OKAY) {
      goto LBL_Y;
    }
  }

  /* reset y by shifting it back down */
  mp_rshd (&y, n - t);

  /* step 3. for i from n down to (t + 1) */
  for (i = n; i >= (t + 1); i--) {
    if (i > x.used) {
      continue;
    }

    /* step 3.1 if xi == yt then set q{i-t-1} to b-1, 
     * otherwise set q{i-t-1} to (xi*b + x{i-1})/yt */
    if (x.dp[i] == y.dp[t]) {
      q.dp[i - t - 1] = ((((mp_digit)1) << DIGIT_BIT) - 1);
    } else {
      mp_word tmp;
      tmp = ((mp_word) x.dp[i]) << ((mp_word) DIGIT_BIT);
      tmp |= ((mp_word) x.dp[i - 1]);
      tmp /= ((mp_word) y.dp[t]);
      if (tmp > (mp_word) MP_MASK)
        tmp = MP_MASK;
      q.dp[i - t - 1] = (mp_digit) (tmp & (mp_word) (MP_MASK));
    }

    /* while (q{i-t-1} * (yt * b + y{t-1})) > 
             xi * b**2 + xi-1 * b + xi-2 
     
       do q{i-t-1} -= 1; 
    */
    q.dp[i - t - 1] = (q.dp[i - t - 1] + 1) & MP_MASK;
    do {
      q.dp[i - t - 1] = (q.dp[i - t - 1] - 1) & MP_MASK;

      /* find left hand */
      mp_zero (&t1);
      t1.dp[0] = (t - 1 < 0) ? 0 : y.dp[t - 1];
      t1.dp[1] = y.dp[t];
      t1.used = 2;
      if ((res = mp_mul_d (&t1, q.dp[i - t - 1], &t1)) != MP_OKAY) {
        goto LBL_Y;
      }

      /* find right hand */
      t2.dp[0] = (i - 2 < 0) ? 0 : x.dp[i - 2];
      t2.dp[1] = (i - 1 < 0) ? 0 : x.dp[i - 1];
      t2.dp[2] = x.dp[i];
      t2.used = 3;
    } while (mp_cmp_mag(&t1, &t2) == MP_GT);

    /* step 3.3 x = x - q{i-t-1} * y * b**{i-t-1} */
    if ((res = mp_mul_d (&y, q.dp[i - t - 1], &t1)) != MP_OKAY) {
      goto LBL_Y;
    }

    if ((res = mp_lshd (&t1, i - t - 1)) != MP_OKAY) {
      goto LBL_Y;
    }

    if ((res = mp_sub (&x, &t1, &x)) != MP_OKAY) {
      goto LBL_Y;
    }

    /* if x < 0 then { x = x + y*b**{i-t-1}; q{i-t-1} -= 1; } */
    if (x.sign == MP_NEG) {
      if ((res = mp_copy (&y, &t1)) != MP_OKAY) {
        goto LBL_Y;
      }
      if ((res = mp_lshd (&t1, i - t - 1)) != MP_OKAY) {
        goto LBL_Y;
      }
      if ((res = mp_add (&x, &t1, &x)) != MP_OKAY) {
        goto LBL_Y;
      }

      q.dp[i - t - 1] = (q.dp[i - t - 1] - 1UL) & MP_MASK;
    }
  }

  /* now q is the quotient and x is the remainder 
   * [which we have to normalize] 
   */
  
  /* get sign before writing to c */
  x.sign = x.used == 0 ? MP_ZPOS : a->sign;

  if (c != NULL) {
    mp_clamp (&q);
    mp_exch (&q, c);
    c->sign = neg;
  }

  if (d != NULL) {
    mp_div_2d (&x, norm, &x, NULL);
    mp_exch (&x, d);
  }

  res = MP_OKAY;

LBL_Y:mp_clear (&y);
LBL_X:mp_clear (&x);
LBL_T2:mp_clear (&t2);
LBL_T1:mp_clear (&t1);
LBL_Q:mp_clear (&q);
  return res;
}